

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void anon_unknown.dwarf_5afedd::sha256::Initialize(uint32_t *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s[0] = 0x6a09e667;
  s[1] = 0xbb67ae85;
  s[2] = 0x3c6ef372;
  s[3] = 0xa54ff53a;
  s[4] = 0x510e527f;
  s[5] = 0x9b05688c;
  s[6] = 0x1f83d9ab;
  s[7] = 0x5be0cd19;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void inline Initialize(uint32_t* s)
{
    s[0] = 0x6a09e667ul;
    s[1] = 0xbb67ae85ul;
    s[2] = 0x3c6ef372ul;
    s[3] = 0xa54ff53aul;
    s[4] = 0x510e527ful;
    s[5] = 0x9b05688cul;
    s[6] = 0x1f83d9abul;
    s[7] = 0x5be0cd19ul;
}